

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void brotli::RunLengthCodeZeros
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v_in,
               uint32_t *max_run_length_prefix,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v_out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *extra_bits)

{
  ulong uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar2;
  const_reference pvVar3;
  uint *puVar4;
  bool bVar5;
  uint32_t local_9c;
  value_type_conflict local_6c;
  value_type_conflict local_68;
  uint32_t local_64;
  size_type sStack_60;
  uint32_t run_length_prefix;
  size_t k;
  value_type_conflict local_50;
  uint32_t reps_1;
  ulong local_48;
  size_t i_1;
  uint32_t max_prefix;
  uint32_t reps;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_28;
  uint32_t max_reps;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *extra_bits_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_out_local;
  uint32_t *max_run_length_prefix_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_in_local;
  
  i._4_4_ = 0;
  _max_prefix = 0;
  pvStack_28 = extra_bits;
  extra_bits_local = v_out;
  v_out_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)max_run_length_prefix;
  max_run_length_prefix_local = (uint32_t *)v_in;
  while (uVar1 = _max_prefix,
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           max_run_length_prefix_local), uVar1 < sVar2) {
    while( true ) {
      uVar1 = _max_prefix;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         max_run_length_prefix_local);
      bVar5 = false;
      if (uVar1 < sVar2) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            max_run_length_prefix_local,_max_prefix);
        bVar5 = *pvVar3 != 0;
      }
      if (!bVar5) break;
      _max_prefix = _max_prefix + 1;
    }
    i_1._4_4_ = 0;
    while( true ) {
      uVar1 = _max_prefix;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         max_run_length_prefix_local);
      bVar5 = false;
      if (uVar1 < sVar2) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            max_run_length_prefix_local,_max_prefix);
        bVar5 = *pvVar3 == 0;
      }
      if (!bVar5) break;
      i_1._4_4_ = i_1._4_4_ + 1;
      _max_prefix = _max_prefix + 1;
    }
    puVar4 = std::max<unsigned_int>((uint *)((long)&i_1 + 4),(uint *)((long)&i + 4));
    i._4_4_ = *puVar4;
  }
  if (i._4_4_ == 0) {
    local_9c = 0;
  }
  else {
    local_9c = Log2FloorNonZero((ulong)i._4_4_);
  }
  i_1._0_4_ = local_9c;
  puVar4 = std::min<unsigned_int>((uint *)&i_1,(uint *)v_out_local);
  i_1._0_4_ = *puVar4;
  *(uint *)&(v_out_local->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start = (uint)i_1;
  local_48 = 0;
  do {
    while( true ) {
      uVar1 = local_48;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         max_run_length_prefix_local);
      if (sVar2 <= uVar1) {
        return;
      }
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          max_run_length_prefix_local,local_48);
      this = extra_bits_local;
      if (*pvVar3 == 0) break;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          max_run_length_prefix_local,local_48);
      reps_1 = *pvVar3 + *(int *)&(v_out_local->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this,&reps_1);
      local_50 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_28,&local_50);
      local_48 = local_48 + 1;
    }
    k._4_4_ = 1;
    sStack_60 = local_48;
    while( true ) {
      sStack_60 = sStack_60 + 1;
      uVar1 = sStack_60;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         max_run_length_prefix_local);
      bVar5 = false;
      if (uVar1 < sVar2) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            max_run_length_prefix_local,sStack_60);
        bVar5 = *pvVar3 == 0;
      }
      if (!bVar5) break;
      k._4_4_ = k._4_4_ + 1;
    }
    local_48 = k._4_4_ + local_48;
    for (; k._4_4_ != 0; k._4_4_ = k._4_4_ - ((2 << ((byte)(uint)i_1 & 0x1f)) + -1)) {
      if (k._4_4_ < (uint)(2 << ((byte)(uint)i_1 & 0x1f))) {
        local_64 = Log2FloorNonZero((ulong)k._4_4_);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (extra_bits_local,&local_64);
        local_68 = k._4_4_ - (1 << ((byte)local_64 & 0x1f));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_28,&local_68);
        break;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (extra_bits_local,(value_type_conflict *)&i_1);
      local_6c = (1 << ((byte)(uint)i_1 & 0x1f)) - 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_28,&local_6c);
    }
  } while( true );
}

Assistant:

void RunLengthCodeZeros(const std::vector<uint32_t>& v_in,
                        uint32_t* max_run_length_prefix,
                        std::vector<uint32_t>* v_out,
                        std::vector<uint32_t>* extra_bits) {
  uint32_t max_reps = 0;
  for (size_t i = 0; i < v_in.size();) {
    for (; i < v_in.size() && v_in[i] != 0; ++i) ;
    uint32_t reps = 0;
    for (; i < v_in.size() && v_in[i] == 0; ++i) {
      ++reps;
    }
    max_reps = std::max(reps, max_reps);
  }
  uint32_t max_prefix = max_reps > 0 ? Log2FloorNonZero(max_reps) : 0;
  max_prefix = std::min(max_prefix, *max_run_length_prefix);
  *max_run_length_prefix = max_prefix;
  for (size_t i = 0; i < v_in.size();) {
    if (v_in[i] != 0) {
      v_out->push_back(v_in[i] + *max_run_length_prefix);
      extra_bits->push_back(0);
      ++i;
    } else {
      uint32_t reps = 1;
      for (size_t k = i + 1; k < v_in.size() && v_in[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      while (reps != 0) {
        if (reps < (2u << max_prefix)) {
          uint32_t run_length_prefix = Log2FloorNonZero(reps);
          v_out->push_back(run_length_prefix);
          extra_bits->push_back(reps - (1u << run_length_prefix));
          break;
        } else {
          v_out->push_back(max_prefix);
          extra_bits->push_back((1u << max_prefix) - 1u);
          reps -= (2u << max_prefix) - 1u;
        }
      }
    }
  }
}